

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

void __thiscall
spvtools::opt::IRContext::AddCalls
          (IRContext *this,Function *func,
          queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *todo)

{
  Instruction *this_00;
  BasicBlock *pBVar1;
  Instruction **ppIVar2;
  pointer puVar3;
  uint32_t local_2c;
  
  for (puVar3 = (func->blocks_).
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 != (func->blocks_).
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
    pBVar1 = (puVar3->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    ppIVar2 = (Instruction **)
              ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    while (this_00 = *ppIVar2,
          this_00 != &(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      if (this_00->opcode_ == OpFunctionCall) {
        local_2c = Instruction::GetSingleWordInOperand(this_00,0);
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&todo->c,&local_2c);
        pBVar1 = (puVar3->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      }
      ppIVar2 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    }
  }
  return;
}

Assistant:

void IRContext::AddCalls(const Function* func, std::queue<uint32_t>* todo) {
  for (auto bi = func->begin(); bi != func->end(); ++bi)
    for (auto ii = bi->begin(); ii != bi->end(); ++ii)
      if (ii->opcode() == spv::Op::OpFunctionCall)
        todo->push(ii->GetSingleWordInOperand(0));
}